

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O1

QMenuBar * __thiscall MenuBar::createMenuBar(MenuBar *this,QMainWindow *mainWindow)

{
  QMenu *this_00;
  mapped_type *pmVar1;
  QMenuBar *this_01;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QString local_58;
  key_type local_40;
  undefined4 uStack_3c;
  char16_t *pcStack_38;
  qsizetype local_30;
  
  this_00 = (QMenu *)operator_new(0x28);
  QVar2.m_data = (storage_type *)0x4;
  QVar2.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar2);
  local_58.d.d = (Data *)CONCAT44(uStack_3c,local_40);
  local_58.d.ptr = pcStack_38;
  local_58.d.size = local_30;
  QMenu::QMenu(this_00,&local_58,(QWidget *)mainWindow);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  QVar3.m_data = (storage_type *)0x12;
  QVar3.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar3);
  local_58.d.d = (Data *)CONCAT44(uStack_3c,local_40);
  local_58.d.ptr = pcStack_38;
  local_58.d.size = local_30;
  QWidget::setStyleSheet((QString *)this_00);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  local_40 = OPEN_GRAPHIC;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,&local_40);
  QWidget::addAction((QAction *)this_00);
  QMenu::addSeparator();
  local_40 = REM_GRAPHIC;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,&local_40);
  QWidget::addAction((QAction *)this_00);
  local_40 = REM_GRAPHIC;
  pmVar1 = std::
           map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
           ::at(&this->mapAction,&local_40);
  QAction::setEnabled(SUB81(pmVar1,0));
  QMenu::addSeparator();
  local_40 = SAVE_BOARD;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,&local_40);
  QWidget::addAction((QAction *)this_00);
  QMenu::addSeparator();
  local_40 = LOAD_BOARD;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,&local_40);
  QWidget::addAction((QAction *)this_00);
  this_01 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_01,(QWidget *)mainWindow);
  QMenuBar::addMenu((QMenu *)this_01);
  local_40 = SETTINGS;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,&local_40);
  QWidget::addAction((QAction *)this_01);
  local_40 = ABOUT;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,&local_40);
  QWidget::addAction((QAction *)this_01);
  QVar4.m_data = (storage_type *)0x1f;
  QVar4.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar4);
  local_58.d.d = (Data *)CONCAT44(uStack_3c,local_40);
  local_58.d.ptr = pcStack_38;
  local_58.d.size = local_30;
  QWidget::setStyleSheet((QString *)this_01);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,8);
    }
  }
  return this_01;
}

Assistant:

QMenuBar* MenuBar::createMenuBar( QMainWindow* mainWindow )
{
    QMenu* fileMenu = new QMenu( "File", mainWindow );
    fileMenu->setStyleSheet( "padding-left:10px;" );

    using enum ActionMenu;
    fileMenu->addAction( &mapAction.at( OPEN_GRAPHIC ));
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( REM_GRAPHIC ));
    mapAction.at( REM_GRAPHIC ).setEnabled( false );
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( SAVE_BOARD ));
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( LOAD_BOARD ));

    QMenuBar* menuBar = new QMenuBar( mainWindow );
    menuBar->addMenu( fileMenu );
    menuBar->addAction( &mapAction.at( SETTINGS ));
    menuBar->addAction( &mapAction.at( ABOUT ));
    menuBar->setStyleSheet( "padding-left: 5px; margin: 3px;" );
    return menuBar;
}